

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

gdImagePtr gdImageScale(gdImagePtr src,uint new_width,uint new_height)

{
  byte bVar1;
  gdInterpolationMethod gVar2;
  int *piVar3;
  uchar *puVar4;
  int **ppiVar5;
  int **ppiVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  gdImagePtr pgVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  gdImagePtr im;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int *piVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  undefined1 *puVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  undefined4 *puVar44;
  long dst_h;
  gdFixed f_dx;
  long dst_w;
  gdFixed f_dy;
  undefined1 local_b8 [8];
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_84;
  int local_80;
  int local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  
  if (src == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  gVar2 = src->interpolation_id;
  if (GD_LINEAR < gVar2) {
    return (gdImagePtr)0x0;
  }
  if (new_height == 0 || new_width == 0) {
    return (gdImagePtr)0x0;
  }
  uVar7 = src->sx;
  if ((uVar7 == new_width) && (src->sy == new_height)) {
LAB_00118322:
    pgVar12 = gdImageClone(src);
    return pgVar12;
  }
  uVar19 = (ulong)new_width;
  uVar20 = (ulong)new_height;
  if (gVar2 - GD_BICUBIC < 2) {
    iVar11 = src->sy;
    if (src->trueColor == 0) {
      gdImagePaletteToTrueColor(src);
    }
    pgVar12 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar12 == (gdImagePtr)0x0) {
      return (gdImagePtr)0x0;
    }
    pgVar12->saveAlphaFlag = 1;
    ppiVar5 = pgVar12->tpixels;
    lVar13 = (long)(int)uVar7 + -1;
    lVar31 = (long)(int)uVar7 + -2;
    ppiVar6 = src->tpixels;
    uVar21 = 0;
    do {
      if (uVar21 == uVar20) {
        return pgVar12;
      }
      lVar30 = uVar21 * (long)(((float)iVar11 / (float)uVar20) * 256.0) * 0x100;
      lVar18 = lVar30 >> 0x10;
      lVar17 = lVar18 * 0x100 - (lVar30 >> 8);
      piVar27 = ppiVar5[uVar21];
      local_78 = (undefined4)((ulong)lVar30 >> 0x10);
      for (uVar33 = 0; uVar33 != uVar19; uVar33 = uVar33 + 1) {
        lVar30 = uVar33 * (long)(((float)(int)uVar7 / (float)uVar19) * 256.0) * 0x100;
        lVar28 = lVar30 >> 0x10;
        local_a4 = (int)((ulong)lVar30 >> 0x10);
        local_74 = local_78;
        local_b0 = local_a4;
        local_ac = local_a4;
        if (0 < lVar18) {
          local_b0 = (uint)(lVar28 < lVar13) + local_a4;
          if (lVar28 < lVar31) {
            local_ac = local_a4 + 2;
          }
        }
        local_a8 = local_a4 + -1;
        if (lVar28 < 1) {
          local_a8 = local_a4;
        }
        local_a0 = (uint)(lVar28 < lVar13) + local_a4;
        local_9c = local_a4 + 2;
        if (lVar31 <= lVar28) {
          local_9c = local_a4;
        }
        local_98 = local_a4 + -1;
        if (lVar28 < 1) {
          local_98 = local_a4;
        }
        local_8c = local_9c;
        if ((long)iVar11 + -1 <= lVar18) {
          local_98 = local_a4;
          local_8c = local_a4;
        }
        local_70 = local_78;
        uStack_6c = local_78;
        uStack_68 = local_78;
        uStack_64 = local_78;
        local_94 = local_a4;
        local_60 = local_78;
        uStack_5c = local_78;
        uStack_58 = local_78;
        uStack_54 = local_78;
        local_90 = (uint)(lVar18 < (long)iVar11 + -1 && lVar28 < lVar13) + local_a4;
        local_50 = local_78;
        local_4c = local_78;
        local_48 = local_78;
        local_7c = local_a4;
        if (lVar18 < iVar11 + -2) {
          local_84 = local_a4;
          local_44 = local_78;
          local_a4 = local_a0;
          local_7c = local_9c;
        }
        lVar29 = lVar28 * 0x100 - (lVar30 >> 8);
        local_80 = local_a4;
        local_40 = local_78;
        local_3c = local_78;
        puVar44 = &local_78;
        puVar38 = local_b8;
        lVar39 = 0;
        lVar36 = 0;
        lVar32 = 0;
        lVar28 = 0;
        for (lVar30 = -1; lVar30 != 3; lVar30 = lVar30 + 1) {
          lVar34 = lVar30 * 0x100;
          uVar35 = lVar34 + lVar17;
          if ((long)uVar35 < -0x1ff) {
            uVar16 = 0;
LAB_00118857:
            lVar14 = 0;
            uVar22 = 0;
LAB_00118859:
            uVar35 = 0;
          }
          else {
            lVar14 = uVar35 + 0x200;
            uVar16 = ((ulong)(lVar14 * lVar14) >> 8) * lVar14 >> 8;
            if ((long)uVar35 < -0xff) goto LAB_00118857;
            lVar14 = lVar17 + lVar34 + 0x100;
            uVar22 = ((ulong)(lVar14 * lVar14) >> 8) * lVar14 >> 6 & 0x7ffffffffffffc;
            if ((long)uVar35 < 1) {
              lVar14 = 0;
              goto LAB_00118859;
            }
            lVar14 = ((uVar35 * uVar35 >> 8) * uVar35 >> 8) * 6;
            if (uVar35 < 0x101) goto LAB_00118859;
            lVar34 = lVar34 + lVar17 + -0x100;
            uVar35 = ((ulong)(lVar34 * lVar34) >> 8) * lVar34 >> 6 & 0x7ffffffffffffc;
          }
          lVar34 = 0;
          for (lVar41 = 0; lVar41 != 0x400; lVar41 = lVar41 + 0x100) {
            uVar40 = (lVar29 + lVar41) - 0x100;
            if ((long)uVar40 < -0x1ff) {
              uVar23 = 0;
LAB_0011894d:
              lVar15 = 0;
              uVar26 = 0;
LAB_0011894f:
              uVar40 = 0;
            }
            else {
              lVar15 = lVar29 + lVar41 + 0x100;
              uVar23 = ((ulong)(lVar15 * lVar15) >> 8) * lVar15 >> 8;
              if ((long)uVar40 < -0xff) goto LAB_0011894d;
              lVar15 = lVar29 + lVar41;
              uVar26 = ((ulong)(lVar15 * lVar15) >> 8) * lVar15 >> 6 & 0x7ffffffffffffc;
              if ((long)uVar40 < 1) {
                lVar15 = 0;
                goto LAB_0011894f;
              }
              lVar15 = ((uVar40 * uVar40 >> 8) * uVar40 >> 8) * 6;
              if (uVar40 < 0x101) goto LAB_0011894f;
              lVar42 = lVar29 + lVar41 + -0x200;
              uVar40 = ((ulong)(lVar42 * lVar42) >> 8) * lVar42 >> 6 & 0x7ffffffffffffc;
            }
            lVar15 = ((long)(((lVar15 + uVar23) - (uVar26 + uVar40)) * 0x100) / 0x600) *
                     ((long)(((lVar14 + uVar16) - (uVar22 + uVar35)) * 0x100) / 0x600) >> 8;
            uVar8 = ppiVar6[*(uint *)((long)puVar44 + lVar34)][*(uint *)(puVar38 + lVar34)];
            lVar28 = lVar28 + ((long)((ulong)(uVar8 >> 8 & 0xff00) * lVar15) >> 8);
            lVar32 = lVar32 + ((long)((ulong)(uVar8 & 0xff00) * lVar15) >> 8);
            lVar36 = lVar36 + ((long)((ulong)(ushort)(uVar8 << 8) * lVar15) >> 8);
            lVar39 = lVar39 + ((long)((ulong)(uVar8 >> 0x10 & 0x7f00) * lVar15) >> 8);
            lVar34 = lVar34 + 4;
          }
          puVar38 = puVar38 + 0x10;
          puVar44 = puVar44 + 4;
        }
        lVar30 = lVar28 * 0x10a >> 0x10;
        uVar8 = 0xff0000;
        if (lVar30 < 0x100) {
          if (lVar30 < 0) {
            uVar8 = 0;
          }
          else {
            uVar8 = ((uint)((ulong)(lVar28 * 0x10a) >> 0x10) & 0xff) << 0x10;
          }
        }
        lVar30 = lVar32 * 0x10a >> 0x10;
        uVar9 = 0xff00;
        if (lVar30 < 0x100) {
          if (lVar30 < 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = ((uint)((ulong)(lVar32 * 0x10a) >> 0x10) & 0xff) << 8;
          }
        }
        lVar30 = lVar36 * 0x10a >> 0x10;
        if (lVar30 < 1) {
          lVar30 = 0;
        }
        if (0xfe < lVar30) {
          lVar30 = 0xff;
        }
        lVar28 = lVar39 * 0x10a >> 0x10;
        uVar10 = 0x7f000000;
        if (lVar28 < 0x80) {
          if (lVar28 < 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (int)((ulong)(lVar39 * 0x10a) >> 0x10) << 0x18;
          }
        }
        piVar27[uVar33] = uVar8 | (uint)lVar30 | uVar9 | uVar10;
      }
      uVar21 = uVar21 + 1;
    } while( true );
  }
  if ((gVar2 == GD_BILINEAR_FIXED) || (gVar2 == GD_LINEAR)) {
    lVar13 = (long)(((float)(int)uVar7 / (float)uVar19) * 256.0);
    lVar31 = (long)(((float)src->sy / (float)uVar20) * 256.0);
    if (src->trueColor == 0) {
      uVar7 = src->transparent;
      pgVar12 = gdImageCreateTrueColor(new_width,new_height);
      if (pgVar12 == (gdImagePtr)0x0) {
        return (gdImagePtr)0x0;
      }
      if ((int)uVar7 < 0) {
        iVar11 = -1;
      }
      else {
        iVar11 = src->green[uVar7] * 0x100 +
                 src->red[uVar7] * 0x10000 + src->alpha[uVar7] * 0x1000000 + src->blue[uVar7];
      }
      pgVar12->transparent = iVar11;
      for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
        lVar17 = uVar21 * lVar31 * 0x100;
        lVar30 = (lVar17 >> 8) + (lVar17 >> 0x10) * -0x100;
        iVar11 = (int)((ulong)lVar17 >> 0x10);
        lVar17 = 0;
        for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
          lVar18 = (lVar17 >> 8) + (lVar17 >> 0x10) * -0x100;
          iVar24 = (int)((ulong)lVar17 >> 0x10);
          uVar7 = getPixelOverflowPalette(src,iVar24,iVar11,0);
          uVar8 = getPixelOverflowPalette(src,iVar24 + 1,iVar11,uVar7);
          uVar9 = getPixelOverflowPalette(src,iVar24,iVar11 + 1,uVar7);
          uVar10 = getPixelOverflowPalette(src,iVar24 + 1,iVar11 + 1,uVar7);
          iVar37 = (int)((ulong)((0x100 - lVar18) * (0x100 - lVar30)) >> 8);
          iVar24 = (int)((ulong)(lVar18 * (0x100 - lVar30)) >> 8);
          iVar25 = (int)((ulong)((0x100 - lVar18) * lVar30) >> 8);
          iVar43 = (int)((ulong)(lVar18 * lVar30) >> 8);
          pgVar12->tpixels[uVar21][uVar33] =
               ((uVar10 & 0xff) * 0x100 * iVar43 >> 8) + ((uVar9 & 0xff) * 0x100 * iVar25 >> 8) +
               ((uVar8 & 0xff) * 0x100 * iVar24 >> 8) + ((uVar7 & 0xff) * 0x100 * iVar37 >> 8) >> 8
               & 0xff | ((uVar10 & 0xff00) * iVar43 >> 8) + ((uVar9 & 0xff00) * iVar25 >> 8) +
                        ((uVar8 & 0xff00) * iVar24 >> 8) + ((uVar7 & 0xff00) * iVar37 >> 8) & 0xff00
                        | (((uVar10 >> 8 & 0xff00) * iVar43 >> 8) +
                           ((uVar9 >> 8 & 0xff00) * iVar25 >> 8) +
                           ((uVar8 >> 8 & 0xff00) * iVar24 >> 8) +
                           ((uVar7 >> 8 & 0xff00) * iVar37 >> 8) & 0xff00) << 8 |
                        (((uVar10 >> 0x10 & 0x7f00) * iVar43 >> 8) +
                         ((uVar9 >> 0x10 & 0x7f00) * iVar25 >> 8) +
                         ((uVar8 >> 0x10 & 0x7f00) * iVar24 >> 8) +
                         ((uVar7 >> 0x10 & 0x7f00) * iVar37 >> 8) & 0xff00) << 0x10;
          lVar17 = lVar17 + lVar13 * 0x100;
        }
      }
      return pgVar12;
    }
    pgVar12 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar12 == (gdImagePtr)0x0) {
      return (gdImagePtr)0x0;
    }
    for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
      lVar17 = uVar21 * lVar31 * 0x100;
      lVar30 = (lVar17 >> 8) + (lVar17 >> 0x10) * -0x100;
      iVar11 = (int)((ulong)lVar17 >> 0x10);
      lVar17 = 0;
      for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
        lVar18 = (lVar17 >> 8) + (lVar17 >> 0x10) * -0x100;
        iVar24 = (int)((ulong)lVar17 >> 0x10);
        uVar7 = getPixelOverflowTC(src,iVar24,iVar11,0);
        uVar8 = getPixelOverflowTC(src,iVar24 + 1,iVar11,uVar7);
        uVar9 = getPixelOverflowTC(src,iVar24,iVar11 + 1,uVar7);
        uVar10 = getPixelOverflowTC(src,iVar24 + 1,iVar11 + 1,uVar7);
        iVar37 = (int)((ulong)((0x100 - lVar18) * (0x100 - lVar30)) >> 8);
        iVar24 = (int)((ulong)(lVar18 * (0x100 - lVar30)) >> 8);
        iVar25 = (int)((ulong)((0x100 - lVar18) * lVar30) >> 8);
        iVar43 = (int)((ulong)(lVar18 * lVar30) >> 8);
        pgVar12->tpixels[uVar21][uVar33] =
             ((uVar10 & 0xff) * 0x100 * iVar43 >> 8) + ((uVar9 & 0xff) * 0x100 * iVar25 >> 8) +
             ((uVar8 & 0xff) * 0x100 * iVar24 >> 8) + ((uVar7 & 0xff) * 0x100 * iVar37 >> 8) >> 8 &
             0xff | ((uVar10 & 0xff00) * iVar43 >> 8) + ((uVar9 & 0xff00) * iVar25 >> 8) +
                    ((uVar8 & 0xff00) * iVar24 >> 8) + ((uVar7 & 0xff00) * iVar37 >> 8) & 0xff00 |
                    (((uVar10 >> 8 & 0xff00) * iVar43 >> 8) + ((uVar9 >> 8 & 0xff00) * iVar25 >> 8)
                     + ((uVar8 >> 8 & 0xff00) * iVar24 >> 8) + ((uVar7 >> 8 & 0xff00) * iVar37 >> 8)
                    & 0xff00) << 8 |
                    (((uVar10 >> 0x10 & 0x7f00) * iVar43 >> 8) +
                     ((uVar9 >> 0x10 & 0x7f00) * iVar25 >> 8) +
                     ((uVar8 >> 0x10 & 0x7f00) * iVar24 >> 8) +
                     ((uVar7 >> 0x10 & 0x7f00) * iVar37 >> 8) & 0xff00) << 0x10;
        lVar17 = lVar17 + lVar13 * 0x100;
      }
    }
    return pgVar12;
  }
  if (gVar2 == GD_NEAREST_NEIGHBOUR) {
    iVar11 = src->sy;
    pgVar12 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar12 == (gdImagePtr)0x0) {
      return (gdImagePtr)0x0;
    }
    lVar13 = (long)(((float)(int)uVar7 / (float)uVar19) * 256.0);
    for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
      lVar31 = (long)((ulong)(uint)((int)uVar21 << 8) *
                     (long)(((float)iVar11 / (float)uVar20) * 256.0)) >> 0x10;
      piVar27 = pgVar12->tpixels[uVar21];
      if (src->trueColor == 0) {
        puVar4 = src->pixels[lVar31];
        for (uVar33 = 0; uVar19 << 8 != uVar33; uVar33 = uVar33 + 0x100) {
          bVar1 = puVar4[(long)((uVar33 & 0xffffffff) * lVar13) >> 0x10];
          *piVar27 = src->green[bVar1] * 0x100 +
                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 + src->blue[bVar1];
          piVar27 = piVar27 + 1;
        }
      }
      else {
        piVar3 = src->tpixels[lVar31];
        for (uVar33 = 0; uVar19 << 8 != uVar33; uVar33 = uVar33 + 0x100) {
          *piVar27 = piVar3[(long)((uVar33 & 0xffffffff) * lVar13) >> 0x10];
          piVar27 = piVar27 + 1;
        }
      }
    }
    return pgVar12;
  }
  if (src->interpolation == (interpolation_method)0x0) {
    return (gdImagePtr)0x0;
  }
  uVar8 = src->sy;
  if (uVar8 == new_height && uVar7 == new_width) goto LAB_00118322;
  if (src->trueColor == 0) {
    gdImagePaletteToTrueColor(src);
  }
  pgVar12 = src;
  if (uVar7 != new_width) {
    pgVar12 = gdImageCreateTrueColor(new_width,uVar8);
    if (pgVar12 == (gdImagePtr)0x0) {
      return (gdImagePtr)0x0;
    }
    gdImageSetInterpolationMethod(pgVar12,src->interpolation_id);
    iVar11 = _gdScalePass(src,uVar7,pgVar12,new_width,uVar8,HORIZONTAL);
    if (iVar11 == 0) goto LAB_00119257;
  }
  if (uVar8 == new_height) {
    return pgVar12;
  }
  im = gdImageCreateTrueColor(new_width,new_height);
  if (im != (gdImagePtr)0x0) {
    gdImageSetInterpolationMethod(im,src->interpolation_id);
    iVar11 = _gdScalePass(pgVar12,uVar8,im,new_height,new_width,VERTICAL);
    if (iVar11 == 0) {
      gdImageDestroy(im);
      if (pgVar12 == src) {
        return (gdImagePtr)0x0;
      }
LAB_00119257:
      gdImageDestroy(pgVar12);
      return (gdImagePtr)0x0;
    }
  }
  if (pgVar12 != src) {
    gdImageDestroy(pgVar12);
    return im;
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageScale(const gdImagePtr src, const unsigned int new_width, const unsigned int new_height)
{
	gdImagePtr im_scaled = NULL;

	if (src == NULL || (uintmax_t)src->interpolation_id >= GD_METHOD_COUNT) {
		return NULL;
	}

	if (new_width == 0 || new_height == 0) {
		return NULL;
	}
	if (new_width == gdImageSX(src) && new_height == gdImageSY(src)) {
		return gdImageClone(src);
	}
	switch (src->interpolation_id) {
		/*Special cases, optimized implementations */
		case GD_NEAREST_NEIGHBOUR:
			im_scaled = gdImageScaleNearestNeighbour(src, new_width, new_height);
			break;

		case GD_BILINEAR_FIXED:
		case GD_LINEAR:
			im_scaled = gdImageScaleBilinear(src, new_width, new_height);
			break;

		case GD_BICUBIC_FIXED:
		case GD_BICUBIC:
			im_scaled = gdImageScaleBicubicFixed(src, new_width, new_height);
			break;

		/* generic */
		default:
			if (src->interpolation == NULL) {
				return NULL;
			}
			im_scaled = gdImageScaleTwoPass(src, new_width, new_height);
			break;
	}

	return im_scaled;
}